

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Http_client_connection::handle_input(Http_client_connection *this,bool *param_1)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  undefined4 extraout_var;
  network_error *this_00;
  Packet *pPVar5;
  element_type *peVar6;
  bool bVar7;
  allocator local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t sz;
  bool *param_1_local;
  Http_client_connection *this_local;
  
  sz = (size_t)param_1;
  param_1_local = (bool *)this;
  local_20 = Client_connection::read_buf_sz(&this->super_Client_connection);
  while( true ) {
    sVar4 = local_20;
    sVar2 = Client_connection::read_buf_sz(&this->super_Client_connection);
    bVar7 = false;
    if (sVar4 == sVar2) {
      bVar7 = this->resp_packet == (Packet *)0x0;
    }
    if (!bVar7) break;
    pcVar3 = Client_connection::read_buf(&this->super_Client_connection);
    sVar4 = Client_connection::read_buf_sz(&this->super_Client_connection);
    iVar1 = (*(this->super_Connection).super_Event_handler._vptr_Event_handler[0xd])
                      (&this->super_Connection,pcVar3,sVar4);
    local_20 = CONCAT44(extraout_var,iVar1);
    if (local_20 == 0) {
      local_55 = 1;
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Connection closed by peer.",&local_41);
      iqnet::network_error::network_error(this_00,&local_40,false,0);
      local_55 = 0;
      __cxa_throw(this_00,&iqnet::network_error::typeinfo,iqnet::network_error::~network_error);
    }
    pcVar3 = Client_connection::read_buf(&this->super_Client_connection);
    sVar4 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar3,sVar4,&local_79);
    pPVar5 = Client_connection::read_response(&this->super_Client_connection,&local_78,false);
    this->resp_packet = pPVar5;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  if (this->resp_packet != (Packet *)0x0) {
    peVar6 = std::auto_ptr<iqnet::Reactor_base>::operator->(&this->reactor);
    (*peVar6->_vptr_Reactor_base[4])(peVar6,&this->super_Connection);
  }
  return;
}

Assistant:

void Http_client_connection::handle_input( bool& )
{
  for( size_t sz = read_buf_sz(); (sz == read_buf_sz()) && !resp_packet ; )
  {
    if( !(sz = recv( read_buf(), read_buf_sz() )) )
      throw iqnet::network_error( "Connection closed by peer.", false );

    resp_packet = read_response( std::string(read_buf(), sz) );
  }

  if( resp_packet )
    reactor->unregister_handler( this );
}